

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

bool __thiscall
Shell::Options::NonGoalWeightOptionValue::setValue(NonGoalWeightOptionValue *this,string *value)

{
  bool bVar1;
  char *in_RSI;
  long in_RDI;
  float newValue;
  undefined4 in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  undefined1 local_1;
  
  std::__cxx11::string::c_str();
  bVar1 = Lib::Int::stringToFloat
                    (in_RSI,(float *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (bVar1) {
    if (0.0 < in_stack_ffffffffffffffe4) {
      *(float *)(in_RDI + 0x98) = in_stack_ffffffffffffffe4;
      *(int *)(in_RDI + 0xe0) = (int)(in_stack_ffffffffffffffe4 * 100.0);
      *(undefined4 *)(in_RDI + 0xe4) = 100;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Options::NonGoalWeightOptionValue::setValue(const std::string& value)
{
 float newValue;
 if(!Int::stringToFloat(value.c_str(),newValue)) return false;

 if(newValue <= 0.0) return false;

 actualValue=newValue;

  // actualValue contains numerator
  numerator=static_cast<int>(newValue*100);
  // otherValue contains denominator
  denominator=100;

  return true;
}